

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib578.c
# Opt level: O2

int progress_callback(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  FILE *__stream;
  
  __stream = fopen64(libtest_arg2,"wb");
  if (__stream != (FILE *)0x0) {
    if (((long)ulnow >> 0x3f & (long)(ulnow - 9.223372036854776e+18) | (long)ulnow) == 0x19 &&
        ((long)ultotal >> 0x3f & (long)(ultotal - 9.223372036854776e+18) | (long)ultotal) == 0x19) {
      curl_mfprintf(__stream,"PASSED, UL data matched data size\n");
    }
    else {
      curl_mfprintf(__stream,"Progress callback called with UL %f out of %f\n");
    }
    fclose(__stream);
  }
  return 0;
}

Assistant:

static int progress_callback(void *clientp, double dltotal, double dlnow,
                             double ultotal, double ulnow)
{
  FILE *moo = fopen(libtest_arg2, "wb");

  (void)clientp; /* UNUSED */
  (void)dltotal; /* UNUSED */
  (void)dlnow; /* UNUSED */

  if(moo) {
    if((size_t)ultotal == data_size && (size_t)ulnow == data_size)
      fprintf(moo, "PASSED, UL data matched data size\n");
    else
      fprintf(moo, "Progress callback called with UL %f out of %f\n",
              ulnow, ultotal);
    fclose(moo);
  }
  return 0;
}